

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5ApiColumnSize(Fts5Context *pCtx,int iCol,int *pnToken)

{
  long lVar1;
  long lVar2;
  int iVar3;
  i64 *piVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  int i;
  int n;
  char *z;
  int local_3c;
  char *local_38;
  
  lVar1 = *(long *)(*(long *)pCtx + 0x18);
  iVar3 = 0;
  if (((byte)pCtx[0x50] & 4) != 0) {
    if (*(int *)(lVar1 + 0x58) == 0) {
      if (*(long *)(lVar1 + 0x48) == 0) {
        iVar3 = *(int *)(lVar1 + 0x18);
        if (0 < iVar3) {
          lVar6 = *(long *)(lVar1 + 0x28);
          lVar7 = 0;
          do {
            if (*(char *)(lVar6 + lVar7) == '\0') {
              *(undefined4 *)(*(long *)(pCtx + 0x10) + lVar7 * 4) = 0xffffffff;
              iVar3 = *(int *)(lVar1 + 0x18);
            }
            lVar7 = lVar7 + 1;
          } while (lVar7 < iVar3);
        }
LAB_001be633:
        iVar3 = 0;
      }
      else {
        lVar6 = 0;
        lVar7 = 0;
        do {
          if (*(int *)(lVar1 + 0x18) <= lVar7) goto LAB_001be633;
          iVar3 = 0;
          if (*(char *)(*(long *)(lVar1 + 0x28) + lVar7) == '\0') {
            lVar2 = *(long *)(pCtx + 0x10);
            *(undefined4 *)(lVar2 + lVar6) = 0;
            iVar3 = fts5ApiColumnText(pCtx,(int)lVar7,&local_38,&local_3c);
            if (iVar3 == 0) {
              if (local_38 == (char *)0x0) {
                iVar3 = 0;
              }
              else {
                iVar3 = (**(code **)(*(long *)(lVar1 + 0x70) + 0x10))
                                  (*(undefined8 *)(lVar1 + 0x68),lVar2 + lVar6,8,local_38,local_3c,
                                   fts5ColumnSizeCb);
              }
            }
          }
          lVar7 = lVar7 + 1;
          lVar6 = lVar6 + 4;
        } while (iVar3 == 0);
      }
    }
    else {
      if (*(long *)(pCtx + 0x48) == 0) {
        piVar4 = (i64 *)(*(long *)(*(long *)(pCtx + 0x40) + 0x10) + 0x18);
      }
      else {
        piVar4 = (i64 *)(*(long *)(pCtx + 0x48) + 8);
      }
      iVar3 = sqlite3Fts5StorageDocsize
                        (*(Fts5Storage **)(*(long *)pCtx + 0x28),*piVar4,*(int **)(pCtx + 0x10));
    }
    pCtx[0x50] = (Fts5Context)((byte)pCtx[0x50] & 0xfb);
  }
  if (iCol < 0) {
    *pnToken = 0;
    if (0 < *(int *)(lVar1 + 0x18)) {
      lVar6 = *(long *)(pCtx + 0x10);
      iVar5 = 0;
      lVar7 = 0;
      do {
        iVar5 = iVar5 + *(int *)(lVar6 + lVar7 * 4);
        *pnToken = iVar5;
        lVar7 = lVar7 + 1;
      } while (lVar7 < *(int *)(lVar1 + 0x18));
    }
  }
  else {
    if (iCol < *(int *)(lVar1 + 0x18)) {
      iVar5 = *(int *)(*(long *)(pCtx + 0x10) + (ulong)(uint)iCol * 4);
    }
    else {
      iVar3 = 0x19;
      iVar5 = 0;
    }
    *pnToken = iVar5;
  }
  return iVar3;
}

Assistant:

static int fts5ApiColumnSize(Fts5Context *pCtx, int iCol, int *pnToken){
  Fts5Cursor *pCsr = (Fts5Cursor*)pCtx;
  Fts5FullTable *pTab = (Fts5FullTable*)(pCsr->base.pVtab);
  Fts5Config *pConfig = pTab->p.pConfig;
  int rc = SQLITE_OK;

  if( CsrFlagTest(pCsr, FTS5CSR_REQUIRE_DOCSIZE) ){
    if( pConfig->bColumnsize ){
      i64 iRowid = fts5CursorRowid(pCsr);
      rc = sqlite3Fts5StorageDocsize(pTab->pStorage, iRowid, pCsr->aColumnSize);
    }else if( pConfig->zContent==0 ){
      int i;
      for(i=0; i<pConfig->nCol; i++){
        if( pConfig->abUnindexed[i]==0 ){
          pCsr->aColumnSize[i] = -1;
        }
      }
    }else{
      int i;
      for(i=0; rc==SQLITE_OK && i<pConfig->nCol; i++){
        if( pConfig->abUnindexed[i]==0 ){
          const char *z; int n;
          void *p = (void*)(&pCsr->aColumnSize[i]);
          pCsr->aColumnSize[i] = 0;
          rc = fts5ApiColumnText(pCtx, i, &z, &n);
          if( rc==SQLITE_OK ){
            rc = sqlite3Fts5Tokenize(
                pConfig, FTS5_TOKENIZE_AUX, z, n, p, fts5ColumnSizeCb
            );
          }
        }
      }
    }
    CsrFlagClear(pCsr, FTS5CSR_REQUIRE_DOCSIZE);
  }
  if( iCol<0 ){
    int i;
    *pnToken = 0;
    for(i=0; i<pConfig->nCol; i++){
      *pnToken += pCsr->aColumnSize[i];
    }
  }else if( iCol<pConfig->nCol ){
    *pnToken = pCsr->aColumnSize[iCol];
  }else{
    *pnToken = 0;
    rc = SQLITE_RANGE;
  }
  return rc;
}